

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O3

string * __thiscall
miniros::Subscription::md5sum_abi_cxx11_(string *__return_storage_ptr__,Subscription *this)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->md5sum_mutex_);
  if (iVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->md5sum_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->md5sum_)._M_string_length);
    pthread_mutex_unlock((pthread_mutex_t *)&this->md5sum_mutex_);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

const std::string Subscription::md5sum()
{
  std::scoped_lock<std::mutex> lock(md5sum_mutex_);
  return md5sum_;
}